

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void decode_partition(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *reader,
                     BLOCK_SIZE bsize,int parse_decode_flag)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  FRAME_CONTEXT *pFVar6;
  MB_MODE_INFO **ppMVar7;
  aom_reader *reader_00;
  od_ec_dec *poVar8;
  AV1Decoder *pbi_00;
  short sVar9;
  int iVar10;
  RestorationType RVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  undefined4 in_register_0000000c;
  BLOCK_SIZE BVar18;
  ulong uVar19;
  size_t __n;
  BLOCK_SIZE BVar20;
  int iVar21;
  RestorationUnitInfo *pRVar22;
  aom_cdf_prob (*icdf) [11];
  block_visitor_fn_t p_Var23;
  RestorationInfo *rsi;
  RestorationInfo *pRVar24;
  long lVar25;
  PARTITION_CONTEXT *pPVar26;
  undefined7 in_register_00000089;
  long lVar27;
  ThreadData *pTVar28;
  char cVar29;
  uint uVar30;
  FRAME_CONTEXT *unaff_R14;
  int7 iVar32;
  ulong uVar31;
  long lVar33;
  bool bVar34;
  int rcol0;
  int rrow1;
  int rcol1;
  int rrow0;
  uint local_f4;
  aom_reader *local_f0;
  ulong local_e8;
  ThreadData *local_e0;
  od_ec_dec *local_d8;
  ulong local_d0;
  uint local_c8;
  uint local_c4;
  AV1Decoder *local_c0;
  int local_b8;
  uint8_t local_b1;
  PARTITION_CONTEXT *local_b0;
  WienerInfo *local_a8;
  ulong local_a0;
  ulong local_98;
  int local_90;
  int local_8c;
  ulong local_88;
  int local_80;
  int local_7c;
  ulong local_78;
  long local_70;
  int local_64;
  RestorationInfo *local_60;
  SgrprojInfo *local_58;
  SgrprojInfo *local_50;
  WienerInfo *local_48;
  AV1Common *local_40;
  long local_38;
  
  local_e8 = CONCAT44(in_register_0000000c,mi_col);
  local_b8 = (int)CONCAT71(in_register_00000089,bsize);
  local_d0 = (ulong)(uint)mi_row;
  uVar31 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  switch(uVar31) {
  case 0:
    bVar34 = false;
    uVar14 = uVar31;
    goto LAB_0016e99b;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_0016e95c_caseD_1:
    bVar34 = true;
    uVar14 = 6;
    goto LAB_0016e99b;
  case 3:
    uVar14 = 1;
    break;
  case 6:
    uVar14 = 2;
    break;
  case 9:
    uVar14 = 3;
    break;
  default:
    if (local_b8 == 0xc) {
      uVar14 = 4;
    }
    else {
      if (local_b8 != 0xf) goto switchD_0016e95c_caseD_1;
      uVar14 = 5;
    }
  }
  bVar34 = false;
LAB_0016e99b:
  BVar18 = BLOCK_INVALID;
  if (!bVar34) {
    BVar18 = subsize_lookup[3][uVar14];
  }
  local_8c = (pbi->common).mi_params.mi_rows;
  local_90 = (pbi->common).mi_params.mi_cols;
  if (local_90 <= mi_col || local_8c <= mi_row) {
    return;
  }
  bVar15 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar31];
  local_a0 = (ulong)bVar15;
  uVar17 = (uint)(bVar15 >> 1);
  local_c8 = uVar17 + mi_row;
  local_c4 = mi_col + uVar17;
  local_88 = (ulong)bsize;
  pTVar28 = td;
  local_f0 = reader;
  local_e0 = td;
  local_c0 = pbi;
  local_98 = uVar31;
  if ((parse_decode_flag & 1U) == 0) {
    iVar10 = (pbi->common).mi_params.mi_rows;
    pPVar26 = (PARTITION_CONTEXT *)CONCAT71((int7)((ulong)unaff_R14 >> 8),0xff);
    if ((mi_row < iVar10) && (iVar21 = (pbi->common).mi_params.mi_cols, mi_col < iVar21)) {
      iVar5 = (pbi->common).mi_params.mi_stride;
      iVar12 = iVar5 * mi_row + mi_col;
      ppMVar7 = (pbi->common).mi_params.mi_grid_base;
      BVar20 = ppMVar7[iVar12]->bsize;
      if (BVar20 == bsize) {
        pPVar26 = (PARTITION_CONTEXT *)0x0;
      }
      else {
        bVar16 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar31];
        bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar20]
        ;
        bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar20]
        ;
        iVar32 = (int7)(int3)((uint)iVar12 >> 8);
        if ((BLOCK_8X8 < bsize) && ((int)local_c8 < iVar10)) {
          if ((int)((uint)(bVar16 >> 1) + mi_col) < iVar21) {
            if (bVar2 == bVar15) {
              pPVar26 = (PARTITION_CONTEXT *)CONCAT71(iVar32,8);
              if ((uint)bVar1 << 2 != (uint)bVar16) {
                cVar29 = (ppMVar7[(long)iVar12 + (long)(int)((uint)(bVar16 >> 1) * iVar5)]->bsize !=
                         BVar20) << 2;
                goto LAB_0016f1b4;
              }
            }
            else {
              local_a0._0_4_ = (uint)bVar15;
              if (bVar1 == bVar16) {
                pPVar26 = (PARTITION_CONTEXT *)CONCAT71(iVar32,9);
                bVar34 = (uint)bVar2 << 2 != (uint)local_a0;
                if (bVar34) {
                  pPVar26 = (PARTITION_CONTEXT *)
                            (ulong)((uint)(ppMVar7[(long)iVar12 + (ulong)uVar17]->bsize != BVar20) *
                                    5 + 2);
                }
              }
              else {
                pPVar26 = (PARTITION_CONTEXT *)CONCAT71(iVar32,3);
                bVar34 = (uint)bVar2 * 2 == (uint)local_a0;
                if (((uint)bVar1 * 2 == (uint)bVar16 && bVar34) &&
                   (pPVar26 = (PARTITION_CONTEXT *)CONCAT71(iVar32,4),
                   "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [ppMVar7[(long)iVar12 + (long)(int)((uint)(bVar16 >> 1) * iVar5)]->bsize] !=
                   bVar15)) {
                  pPVar26 = (PARTITION_CONTEXT *)
                            (ulong)((uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                           [ppMVar7[(long)iVar12 + (ulong)uVar17]->bsize] == bVar16)
                                    * 3 + 3);
                }
              }
            }
            goto LAB_0016f28d;
          }
        }
        pPVar26 = (PARTITION_CONTEXT *)
                  CONCAT71(iVar32,*(undefined1 *)
                                   ((long)&get_partition_base_partitions +
                                   (ulong)(bVar1 < bVar16) + (ulong)(bVar2 < bVar15) * 2));
      }
    }
  }
  else {
    local_40 = &pbi->common;
    local_b1 = ((pbi->common).seq_params)->monochrome;
    local_60 = (pbi->common).rst_info;
    local_48 = (td->dcb).xd.wiener_info;
    local_50 = (td->dcb).xd.sgrproj_info;
    local_d8 = &reader->ec;
    uVar14 = 0;
    do {
      local_78 = uVar14;
      if (((local_60[uVar14].frame_restoration_type != RESTORE_NONE) &&
          (iVar10 = av1_loop_restoration_corners_in_sb
                              (local_40,(int)uVar14,(int)local_d0,(int)local_e8,(BLOCK_SIZE)local_88
                               ,(int *)&local_f4,&local_7c,&local_64,&local_80), iVar10 != 0)) &&
         (local_70 = (long)local_64, local_64 < local_80)) {
        pRVar24 = local_60 + uVar14;
        local_38 = (long)pRVar24->horz_units;
        local_b0 = (PARTITION_CONTEXT *)CONCAT44(local_b0._4_4_,(uint)(local_78 == 0) * 2 + 5);
        local_a8 = local_48 + local_78;
        local_58 = local_50 + local_78;
        do {
          lVar27 = (long)(int)local_f4;
          if ((int)local_f4 < local_7c) {
            lVar33 = local_70 * local_38;
            do {
              pRVar22 = pRVar24->unit_info + lVar27 + lVar33;
              RVar11 = pRVar24->frame_restoration_type;
              if (RVar11 == RESTORE_WIENER) {
                unaff_R14 = (pTVar28->dcb).xd.tile_ctx;
                iVar10 = od_ec_decode_cdf_q15(local_d8,unaff_R14->wiener_restore_cdf,2);
                if (local_f0->allow_update_cdf != '\0') {
                  uVar3 = unaff_R14->wiener_restore_cdf[2];
                  bVar15 = (char)(uVar3 >> 4) + 4;
                  uVar4 = unaff_R14->wiener_restore_cdf[0];
                  if ((char)iVar10 < '\x01') {
                    sVar9 = -(uVar4 >> (bVar15 & 0x1f));
                  }
                  else {
                    sVar9 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar15 & 0x1f));
                  }
                  unaff_R14->wiener_restore_cdf[0] = sVar9 + uVar4;
                  unaff_R14->wiener_restore_cdf[2] = uVar3 + (uVar3 < 0x20);
                }
                if (iVar10 == 0) {
LAB_0016ede5:
                  pRVar22->restoration_type = RESTORE_NONE;
                }
                else {
                  pRVar22->restoration_type = RESTORE_WIENER;
LAB_0016edc9:
                  read_wiener_filter((int)local_b0,&pRVar22->wiener_info,local_a8,local_f0);
                }
              }
              else if (RVar11 == RESTORE_SGRPROJ) {
                unaff_R14 = (pTVar28->dcb).xd.tile_ctx;
                iVar10 = od_ec_decode_cdf_q15(local_d8,unaff_R14->sgrproj_restore_cdf,2);
                if (local_f0->allow_update_cdf != '\0') {
                  uVar3 = unaff_R14->sgrproj_restore_cdf[2];
                  bVar15 = (char)(uVar3 >> 4) + 4;
                  uVar4 = unaff_R14->sgrproj_restore_cdf[0];
                  if ((char)iVar10 < '\x01') {
                    sVar9 = -(uVar4 >> (bVar15 & 0x1f));
                  }
                  else {
                    sVar9 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar15 & 0x1f));
                  }
                  unaff_R14->sgrproj_restore_cdf[0] = sVar9 + uVar4;
                  unaff_R14->sgrproj_restore_cdf[2] = uVar3 + (uVar3 < 0x20);
                }
                if (iVar10 == 0) goto LAB_0016ede5;
                pRVar22->restoration_type = RESTORE_SGRPROJ;
                read_sgrproj_filter(&pRVar22->sgrproj_info,local_58,local_f0);
              }
              else if (RVar11 == RESTORE_SWITCHABLE) {
                pFVar6 = (pTVar28->dcb).xd.tile_ctx;
                unaff_R14 = (FRAME_CONTEXT *)pFVar6->switchable_restore_cdf;
                RVar11 = od_ec_decode_cdf_q15(local_d8,(uint16_t *)unaff_R14,3);
                if (local_f0->allow_update_cdf != '\0') {
                  uVar3 = pFVar6->switchable_restore_cdf[3];
                  bVar15 = (char)(uVar3 >> 4) + 4;
                  lVar25 = 0;
                  do {
                    uVar4 = *(aom_cdf_prob *)((long)unaff_R14 + lVar25 * 2);
                    if (lVar25 < (char)RVar11) {
                      sVar9 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar15 & 0x1f));
                    }
                    else {
                      sVar9 = -(uVar4 >> (bVar15 & 0x1f));
                    }
                    *(ushort *)((long)unaff_R14 + lVar25 * 2) = sVar9 + uVar4;
                    lVar25 = lVar25 + 1;
                  } while (lVar25 != 2);
                  pFVar6->switchable_restore_cdf[3] =
                       pFVar6->switchable_restore_cdf[3] + (ushort)(uVar3 < 0x20);
                }
                pRVar22->restoration_type = RVar11;
                if (RVar11 == RESTORE_SGRPROJ) {
                  read_sgrproj_filter(&pRVar22->sgrproj_info,local_58,local_f0);
                  pTVar28 = local_e0;
                }
                else {
                  pTVar28 = local_e0;
                  if (RVar11 == RESTORE_WIENER) goto LAB_0016edc9;
                }
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 < local_7c);
          }
          local_70 = local_70 + 1;
        } while (local_70 < local_80);
      }
      uVar31 = local_98;
      td = local_e0;
    } while ((local_b1 == '\0') && (uVar14 = local_78 + 1, local_78 < 2));
    bsize = (BLOCK_SIZE)local_b8;
    mi_row = (int)local_d0;
    if (bsize < BLOCK_8X8) {
      pPVar26 = (PARTITION_CONTEXT *)0x0;
    }
    else {
      iVar32 = (int7)((ulong)unaff_R14 >> 8);
      pPVar26 = (PARTITION_CONTEXT *)CONCAT71(iVar32,3);
      if ((int)local_c8 < local_8c || (int)local_c4 < local_90) {
        bVar15 = ""[local_98];
        lVar27 = (ulong)bVar15 - 1;
        bVar34 = ((uint)(int)(pTVar28->dcb).xd.above_partition_context[(int)local_e8] >>
                  ((uint)lVar27 & 0x1f) & 1) != 0;
        uVar17 = ((uint)(int)(pTVar28->dcb).xd.left_partition_context[mi_row & 0x1f] >>
                 ((byte)lVar27 & 0x1f)) * 2 & 2;
        lVar27 = (ulong)(bVar34 + uVar17) + (ulong)bVar15 * 4;
        pFVar6 = (pTVar28->dcb).xd.tile_ctx;
        icdf = pFVar6->partition_cdf + lVar27 + -4;
        if ((int)local_c8 < local_8c && (int)local_c4 < local_90) {
          uVar30 = 4;
          if (bsize != BLOCK_8X8) {
            uVar30 = (bsize != BLOCK_128X128) + 8 + (uint)(bsize != BLOCK_128X128);
          }
          uVar13 = od_ec_decode_cdf_q15(local_d8,*icdf,uVar30);
          pPVar26 = (PARTITION_CONTEXT *)(ulong)uVar13;
          if (local_f0->allow_update_cdf != '\0') {
            uVar3 = (*icdf)[uVar30];
            bVar16 = (char)(uVar3 >> 4) + 5;
            iVar10 = uVar17 + (uint)bVar15 * 4 + (uint)bVar34 + -4;
            uVar31 = 0;
            do {
              uVar4 = pFVar6->partition_cdf[iVar10][uVar31];
              if ((long)uVar31 < (long)(char)uVar13) {
                sVar9 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar16 & 0x1f));
              }
              else {
                sVar9 = -(uVar4 >> (bVar16 & 0x1f));
              }
              pFVar6->partition_cdf[iVar10][uVar31] = sVar9 + uVar4;
              uVar31 = uVar31 + 1;
            } while (uVar30 - 1 != uVar31);
            (*icdf)[uVar30] = (*icdf)[uVar30] + (ushort)(uVar3 < 0x20);
          }
          mi_row = (int)local_d0;
          bsize = (BLOCK_SIZE)local_b8;
          uVar31 = local_98;
          pTVar28 = local_e0;
        }
        else if ((int)local_c8 < local_8c || local_90 <= (int)local_c4) {
          sVar9 = (pFVar6->partition_cdf[lVar27 + -4][6] - pFVar6->partition_cdf[lVar27 + -4][5]) +
                  (pFVar6->partition_cdf[lVar27 + -4][5] - pFVar6->partition_cdf[lVar27 + -4][4]) +
                  (pFVar6->partition_cdf[lVar27 + -4][4] - pFVar6->partition_cdf[lVar27 + -4][3]) +
                  (pFVar6->partition_cdf[lVar27 + -4][3] - pFVar6->partition_cdf[lVar27 + -4][2]) +
                  (pFVar6->partition_cdf[lVar27 + -4][1] - (*icdf)[0] ^ 0x8000);
          if (bsize != BLOCK_128X128) {
            sVar9 = (sVar9 - pFVar6->partition_cdf[lVar27 + -4][7]) +
                    pFVar6->partition_cdf[lVar27 + -4][8];
          }
          local_f4 = (uint)(ushort)(0x8000 - sVar9);
          iVar10 = od_ec_decode_cdf_q15(local_d8,(uint16_t *)&local_f4,2);
          pPVar26 = (PARTITION_CONTEXT *)(CONCAT71(iVar32,iVar10 == 0) ^ 3);
          pTVar28 = td;
        }
        else {
          sVar9 = (pFVar6->partition_cdf[lVar27 + -4][7] - pFVar6->partition_cdf[lVar27 + -4][6]) +
                  (pFVar6->partition_cdf[lVar27 + -4][6] - pFVar6->partition_cdf[lVar27 + -4][5]) +
                  (pFVar6->partition_cdf[lVar27 + -4][4] - pFVar6->partition_cdf[lVar27 + -4][3]) +
                  (pFVar6->partition_cdf[lVar27 + -4][3] - pFVar6->partition_cdf[lVar27 + -4][2]) +
                  (pFVar6->partition_cdf[lVar27 + -4][2] - pFVar6->partition_cdf[lVar27 + -4][1] ^
                  0x8000);
          if (bsize != BLOCK_128X128) {
            sVar9 = (sVar9 - pFVar6->partition_cdf[lVar27 + -4][8]) +
                    pFVar6->partition_cdf[lVar27 + -4][9];
          }
          local_f4 = (uint)(ushort)(0x8000 - sVar9);
          iVar10 = od_ec_decode_cdf_q15(local_d8,(uint16_t *)&local_f4,2);
          cVar29 = (iVar10 != 0) * '\x02';
LAB_0016f1b4:
          pPVar26 = (PARTITION_CONTEXT *)CONCAT71(iVar32,cVar29 + '\x01');
          pTVar28 = td;
        }
      }
    }
  }
LAB_0016f28d:
  BVar20 = BLOCK_INVALID;
  bVar15 = (byte)pPVar26;
  uVar14 = (ulong)pPVar26 & 0xff;
  if (bVar15 != 0xff) {
    if (bsize < BLOCK_32X64) {
      (*(code *)(&DAT_004cbf38 + *(int *)(&DAT_004cbf38 + local_88 * 4)))();
      return;
    }
    if ((int)local_88 == 0xc) {
      lVar27 = 4;
LAB_0016f2ff:
      bVar34 = false;
    }
    else {
      if ((int)local_88 == 0xf) {
        lVar27 = 5;
        goto LAB_0016f2ff;
      }
      lVar27 = 6;
      bVar34 = true;
    }
    if (!bVar34) {
      BVar20 = subsize_lookup[uVar14][lVar27];
    }
  }
  if (BVar20 == BLOCK_INVALID) {
    (pTVar28->dcb).xd.mi_row = mi_row;
    aom_internal_error((pTVar28->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Partition is invalid for block size %dx%d",(ulong)block_size_wide[uVar31],
                       (ulong)block_size_high[uVar31]);
  }
  local_d8 = (od_ec_dec *)(ulong)BVar20;
  if (av1_ss_size_lookup[(long)local_d8][(pTVar28->dcb).xd.plane[1].subsampling_x]
      [(pTVar28->dcb).xd.plane[1].subsampling_y] == BLOCK_INVALID) {
    (local_e0->dcb).xd.mi_row = mi_row;
    aom_internal_error((local_e0->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,
                       "Block size %dx%d invalid with this subsampling mode",
                       (ulong)block_size_wide[(long)local_d8],(ulong)block_size_high[(long)local_d8]
                      );
  }
  pbi_00 = local_c0;
  pTVar28 = local_e0;
  reader_00 = local_f0;
  local_b0 = pPVar26;
  if (9 < bVar15) goto LAB_0016f83c;
  uVar17 = (uint)(local_a0 >> 2) & 0x3fffffff;
  iVar21 = (int)local_d0;
  iVar10 = (int)local_e8;
  BVar20 = (BLOCK_SIZE)local_d8;
  switch(uVar14) {
  case 0:
    (*decode_partition::block_visit[(uint)parse_decode_flag])
              (local_c0,local_e0,iVar21,iVar10,local_f0,bVar15,BVar20);
    break;
  case 1:
    p_Var23 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var23)(local_c0,local_e0,iVar21,iVar10,local_f0,bVar15,BVar20);
    if ((int)local_c8 < local_8c) {
      uVar19 = (ulong)local_c8;
      uVar31 = local_e8;
LAB_0016f718:
      (*p_Var23)(local_c0,local_e0,(int)uVar19,(int)uVar31,local_f0,bVar15,(BLOCK_SIZE)local_d8);
    }
    break;
  case 2:
    p_Var23 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var23)(local_c0,local_e0,iVar21,iVar10,local_f0,bVar15,BVar20);
    if ((int)local_c4 < local_90) {
      uVar31 = (ulong)local_c4;
      uVar19 = local_d0;
      goto LAB_0016f718;
    }
    break;
  case 3:
    decode_partition(local_c0,local_e0,iVar21,iVar10,local_f0,BVar20,parse_decode_flag);
    decode_partition(pbi_00,pTVar28,(int)local_d0,local_c4,reader_00,BVar20,parse_decode_flag);
    uVar17 = local_c8;
    decode_partition(pbi_00,pTVar28,local_c8,(int)local_e8,reader_00,BVar20,parse_decode_flag);
    decode_partition(pbi_00,pTVar28,uVar17,local_c4,reader_00,BVar20,parse_decode_flag);
    break;
  case 4:
    p_Var23 = decode_partition::block_visit[(uint)parse_decode_flag];
    local_a8 = (WienerInfo *)CONCAT44(local_a8._4_4_,(uint)BVar18);
    (*p_Var23)(local_c0,local_e0,iVar21,iVar10,local_f0,bVar15,BVar18);
    (*p_Var23)(pbi_00,pTVar28,iVar21,local_c4,reader_00,bVar15,(BLOCK_SIZE)local_a8);
    BVar18 = (BLOCK_SIZE)local_d8;
    uVar31 = local_e8;
    uVar17 = local_c8;
    goto LAB_0016f7a5;
  case 5:
    p_Var23 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var23)(local_c0,local_e0,iVar21,iVar10,local_f0,bVar15,BVar20);
    uVar17 = local_c8;
    local_a8 = (WienerInfo *)CONCAT44(local_a8._4_4_,(uint)BVar18);
    (*p_Var23)(pbi_00,pTVar28,local_c8,(int)local_e8,reader_00,bVar15,BVar18);
    BVar18 = (BLOCK_SIZE)local_a8;
    uVar31 = (ulong)local_c4;
    goto LAB_0016f7a5;
  case 6:
    p_Var23 = decode_partition::block_visit[(uint)parse_decode_flag];
    local_a8 = (WienerInfo *)CONCAT44(local_a8._4_4_,(uint)BVar18);
    (*p_Var23)(local_c0,local_e0,iVar21,iVar10,local_f0,bVar15,BVar18);
    (*p_Var23)(pbi_00,pTVar28,local_c8,iVar10,reader_00,bVar15,(BLOCK_SIZE)local_a8);
    (*p_Var23)(pbi_00,pTVar28,(int)local_d0,local_c4,reader_00,bVar15,(BLOCK_SIZE)local_d8);
    break;
  case 7:
    p_Var23 = decode_partition::block_visit[(uint)parse_decode_flag];
    (*p_Var23)(local_c0,local_e0,iVar21,iVar10,local_f0,bVar15,BVar20);
    uVar17 = local_c4;
    local_a8 = (WienerInfo *)CONCAT44(local_a8._4_4_,(uint)BVar18);
    (*p_Var23)(pbi_00,pTVar28,iVar21,local_c4,reader_00,bVar15,BVar18);
    BVar18 = (BLOCK_SIZE)local_a8;
    uVar31 = (ulong)uVar17;
    uVar17 = local_c8;
LAB_0016f7a5:
    (*p_Var23)(pbi_00,pTVar28,uVar17,(int)uVar31,reader_00,bVar15,BVar18);
    break;
  case 8:
    iVar10 = 4;
    uVar31 = local_d0 & 0xffffffff;
    do {
      iVar21 = (int)uVar31;
      if ((iVar10 != 4) && ((local_c0->common).mi_params.mi_rows <= iVar21)) break;
      (*decode_partition::block_visit[(uint)parse_decode_flag])
                (local_c0,local_e0,iVar21,(int)local_e8,local_f0,bVar15,(BLOCK_SIZE)local_d8);
      uVar31 = (ulong)(iVar21 + uVar17);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    break;
  case 9:
    iVar10 = 4;
    uVar31 = local_e8 & 0xffffffff;
    do {
      iVar21 = (int)uVar31;
      if ((iVar10 != 4) && ((local_c0->common).mi_params.mi_cols <= iVar21)) break;
      (*decode_partition::block_visit[(uint)parse_decode_flag])
                (local_c0,local_e0,(int)local_d0,iVar21,local_f0,bVar15,(BLOCK_SIZE)local_d8);
      uVar31 = (ulong)(iVar21 + uVar17);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
LAB_0016f83c:
  poVar8 = local_d8;
  pTVar28 = local_e0;
  bVar15 = (byte)local_b8;
  if (bVar15 < 3 || (parse_decode_flag & 1U) == 0) {
    return;
  }
  if (bVar15 < 10) {
    (*(code *)(&DAT_004cbf88 + *(int *)(&DAT_004cbf88 + local_88 * 4)))();
    return;
  }
  if ((int)local_88 == 0xc) {
    lVar27 = 4;
LAB_0016f93b:
    bVar34 = false;
  }
  else {
    if ((int)local_88 == 0xf) {
      lVar27 = 5;
      goto LAB_0016f93b;
    }
    lVar27 = 6;
    bVar34 = true;
  }
  uVar31 = 0xff;
  if (!bVar34) {
    uVar31 = (ulong)subsize_lookup[3][lVar27];
  }
  if (9 < (byte)local_b0) {
    return;
  }
  uVar17 = (uint)local_d0;
  uVar30 = (uint)((byte)(local_a0 >> 1) & 0x7f);
  iVar10 = (int)local_e8;
  switch(uVar14) {
  case 3:
    if (bVar15 != 3) {
      return;
    }
  default:
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [local_98];
    memset((local_e0->dcb).xd.above_partition_context + (int)local_e8,
           (uint)(byte)partition_context_lookup[(long)local_d8].above,local_a0);
    bVar15 = partition_context_lookup[(long)poVar8].left;
    break;
  case 4:
    lVar27 = (long)(int)local_e8;
    local_b0 = (local_e0->dcb).xd.left_partition_context + (uVar17 & 0x1f);
    local_f0 = (aom_reader *)
               (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [(long)local_d8];
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [(long)local_d8];
    memset((local_e0->dcb).xd.above_partition_context + lVar27,
           (uint)(byte)partition_context_lookup[uVar31].above,(size_t)local_f0);
    memset(local_b0,(uint)(byte)partition_context_lookup[uVar31].left,__n);
    uVar17 = uVar30 + (int)local_d0;
    memset((pTVar28->dcb).xd.above_partition_context + lVar27,
           (uint)(byte)partition_context_lookup[(long)poVar8].above,(size_t)local_f0);
    bVar15 = partition_context_lookup[(long)poVar8].left;
    break;
  case 5:
    lVar27 = (long)(int)local_e8;
    local_b0 = (local_e0->dcb).xd.left_partition_context + (uVar17 & 0x1f);
    local_f0 = (aom_reader *)
               (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [(long)local_d8];
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [(long)local_d8];
    memset((local_e0->dcb).xd.above_partition_context + lVar27,
           (uint)(byte)partition_context_lookup[(long)local_d8].above,(size_t)local_f0);
    memset(local_b0,(uint)(byte)partition_context_lookup[(long)poVar8].left,__n);
    pPVar26 = (pTVar28->dcb).xd.left_partition_context + (uVar30 + (int)local_d0 & 0x1f);
    memset((pTVar28->dcb).xd.above_partition_context + lVar27,
           (uint)(byte)partition_context_lookup[uVar31].above,(size_t)local_f0);
    uVar30 = (uint)(byte)partition_context_lookup[uVar31].left;
    goto LAB_0016fca4;
  case 6:
    local_b0 = (local_e0->dcb).xd.left_partition_context + (uVar17 & 0x1f);
    local_f0 = (aom_reader *)
               (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [(long)local_d8];
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [(long)local_d8];
    memset((local_e0->dcb).xd.above_partition_context + (int)local_e8,
           (uint)(byte)partition_context_lookup[uVar31].above,(size_t)local_f0);
    pPVar26 = local_b0;
    memset(local_b0,(uint)(byte)partition_context_lookup[uVar31].left,__n);
    memset((pTVar28->dcb).xd.above_partition_context + (int)(uVar30 + iVar10),
           (uint)(byte)partition_context_lookup[(long)poVar8].above,(size_t)local_f0);
    bVar15 = partition_context_lookup[(long)poVar8].left;
    goto LAB_0016fca1;
  case 7:
    local_b0 = (local_e0->dcb).xd.left_partition_context + (uVar17 & 0x1f);
    local_f0 = (aom_reader *)
               (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [(long)local_d8];
    __n = (size_t)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [(long)local_d8];
    memset((local_e0->dcb).xd.above_partition_context + (int)local_e8,
           (uint)(byte)partition_context_lookup[(long)local_d8].above,(size_t)local_f0);
    pPVar26 = local_b0;
    memset(local_b0,(uint)(byte)partition_context_lookup[(long)poVar8].left,__n);
    memset((pTVar28->dcb).xd.above_partition_context + (int)(uVar30 + iVar10),
           (uint)(byte)partition_context_lookup[uVar31].above,(size_t)local_f0);
    bVar15 = partition_context_lookup[uVar31].left;
LAB_0016fca1:
    uVar30 = (uint)bVar15;
    goto LAB_0016fca4;
  }
  uVar30 = (uint)bVar15;
  pPVar26 = (pTVar28->dcb).xd.left_partition_context + (uVar17 & 0x1f);
LAB_0016fca4:
  memset(pPVar26,uVar30,__n);
  return;
}

Assistant:

static inline void decode_partition(AV1Decoder *const pbi, ThreadData *const td,
                                    int mi_row, int mi_col, aom_reader *reader,
                                    BLOCK_SIZE bsize, int parse_decode_flag) {
  assert(bsize < BLOCK_SIZES_ALL);
  AV1_COMMON *const cm = &pbi->common;
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  const int bw = mi_size_wide[bsize];
  const int hbs = bw >> 1;
  PARTITION_TYPE partition;
  BLOCK_SIZE subsize;
  const int quarter_step = bw / 4;
  BLOCK_SIZE bsize2 = get_partition_subsize(bsize, PARTITION_SPLIT);
  const int has_rows = (mi_row + hbs) < cm->mi_params.mi_rows;
  const int has_cols = (mi_col + hbs) < cm->mi_params.mi_cols;

  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  // parse_decode_flag takes the following values :
  // 01 - do parse only
  // 10 - do decode only
  // 11 - do parse and decode
  static const block_visitor_fn_t block_visit[4] = { NULL, parse_decode_block,
                                                     decode_block,
                                                     parse_decode_block };

  if (parse_decode_flag & 1) {
    const int num_planes = av1_num_planes(cm);
    for (int plane = 0; plane < num_planes; ++plane) {
      int rcol0, rcol1, rrow0, rrow1;

      // Skip some unnecessary work if loop restoration is disabled
      if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

      if (av1_loop_restoration_corners_in_sb(cm, plane, mi_row, mi_col, bsize,
                                             &rcol0, &rcol1, &rrow0, &rrow1)) {
        const int rstride = cm->rst_info[plane].horz_units;
        for (int rrow = rrow0; rrow < rrow1; ++rrow) {
          for (int rcol = rcol0; rcol < rcol1; ++rcol) {
            const int runit_idx = rcol + rrow * rstride;
            loop_restoration_read_sb_coeffs(cm, xd, reader, plane, runit_idx);
          }
        }
      }
    }

    partition = (bsize < BLOCK_8X8) ? PARTITION_NONE
                                    : read_partition(xd, mi_row, mi_col, reader,
                                                     has_rows, has_cols, bsize);
  } else {
    partition = get_partition(cm, mi_row, mi_col, bsize);
  }
  subsize = get_partition_subsize(bsize, partition);
  if (subsize == BLOCK_INVALID) {
    // When an internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done.
    xd->mi_row = mi_row;
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Partition is invalid for block size %dx%d",
                       block_size_wide[bsize], block_size_high[bsize]);
  }
  // Check the bitstream is conformant: if there is subsampling on the
  // chroma planes, subsize must subsample to a valid block size.
  const struct macroblockd_plane *const pd_u = &xd->plane[1];
  if (get_plane_block_size(subsize, pd_u->subsampling_x, pd_u->subsampling_y) ==
      BLOCK_INVALID) {
    // When an internal error occurs ensure that xd->mi_row is set appropriately
    // w.r.t. current tile, which is used to signal processing of current row is
    // done.
    xd->mi_row = mi_row;
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Block size %dx%d invalid with this subsampling mode",
                       block_size_wide[subsize], block_size_high[subsize]);
  }

#define DEC_BLOCK_STX_ARG
#define DEC_BLOCK_EPT_ARG partition,
#define DEC_BLOCK(db_r, db_c, db_subsize)                                  \
  block_visit[parse_decode_flag](pbi, td, DEC_BLOCK_STX_ARG(db_r), (db_c), \
                                 reader, DEC_BLOCK_EPT_ARG(db_subsize))
#define DEC_PARTITION(db_r, db_c, db_subsize)                        \
  decode_partition(pbi, td, DEC_BLOCK_STX_ARG(db_r), (db_c), reader, \
                   (db_subsize), parse_decode_flag)

  switch (partition) {
    case PARTITION_NONE: DEC_BLOCK(mi_row, mi_col, subsize); break;
    case PARTITION_HORZ:
      DEC_BLOCK(mi_row, mi_col, subsize);
      if (has_rows) DEC_BLOCK(mi_row + hbs, mi_col, subsize);
      break;
    case PARTITION_VERT:
      DEC_BLOCK(mi_row, mi_col, subsize);
      if (has_cols) DEC_BLOCK(mi_row, mi_col + hbs, subsize);
      break;
    case PARTITION_SPLIT:
      DEC_PARTITION(mi_row, mi_col, subsize);
      DEC_PARTITION(mi_row, mi_col + hbs, subsize);
      DEC_PARTITION(mi_row + hbs, mi_col, subsize);
      DEC_PARTITION(mi_row + hbs, mi_col + hbs, subsize);
      break;
    case PARTITION_HORZ_A:
      DEC_BLOCK(mi_row, mi_col, bsize2);
      DEC_BLOCK(mi_row, mi_col + hbs, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col, subsize);
      break;
    case PARTITION_HORZ_B:
      DEC_BLOCK(mi_row, mi_col, subsize);
      DEC_BLOCK(mi_row + hbs, mi_col, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col + hbs, bsize2);
      break;
    case PARTITION_VERT_A:
      DEC_BLOCK(mi_row, mi_col, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col, bsize2);
      DEC_BLOCK(mi_row, mi_col + hbs, subsize);
      break;
    case PARTITION_VERT_B:
      DEC_BLOCK(mi_row, mi_col, subsize);
      DEC_BLOCK(mi_row, mi_col + hbs, bsize2);
      DEC_BLOCK(mi_row + hbs, mi_col + hbs, bsize2);
      break;
    case PARTITION_HORZ_4:
      for (int i = 0; i < 4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= cm->mi_params.mi_rows) break;
        DEC_BLOCK(this_mi_row, mi_col, subsize);
      }
      break;
    case PARTITION_VERT_4:
      for (int i = 0; i < 4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= cm->mi_params.mi_cols) break;
        DEC_BLOCK(mi_row, this_mi_col, subsize);
      }
      break;
    default: assert(0 && "Invalid partition type");
  }

#undef DEC_PARTITION
#undef DEC_BLOCK
#undef DEC_BLOCK_EPT_ARG
#undef DEC_BLOCK_STX_ARG

  if (parse_decode_flag & 1)
    update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}